

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

int __thiscall
tiger::trains::network::TCPSocket::connect
          (TCPSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int retVal;
  uint16_t local_10;
  
  local_10 = (uint16_t)__addr;
  uVar1 = htons(local_10);
  (this->serverSockAddr).sin_port = uVar1;
  (this->serverSockAddr).sin_family = 2;
  uVar2 = htonl(__fd);
  (this->serverSockAddr).sin_addr.s_addr = uVar2;
  iVar3 = ::connect(this->pSocket,(sockaddr *)&this->serverSockAddr,0x10);
  return -(uint)(iVar3 == 0) & 0xffffff01;
}

Assistant:

bool TCPSocket::connect(uint32_t addr, int port)
{
    serverSockAddr.sin_port = htons(port);
    serverSockAddr.sin_family = AF_INET;
    serverSockAddr.sin_addr.s_addr = htonl(addr);

    int retVal = ::connect(pSocket, (struct sockaddr *) &serverSockAddr, sizeof(serverSockAddr));
    return retVal == 0 ? true : false;
}